

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O1

CURLcode Curl_sasl_continue(SASL *sasl,connectdata *conn,int code,saslprogress *progress)

{
  SessionHandle *data;
  CURLcode CVar1;
  saslstate sVar2;
  char *valuep;
  char *resp;
  size_t len;
  char *chlg;
  size_t chlglen;
  char *serverdata;
  char *local_58;
  size_t local_50;
  uchar *local_48;
  size_t local_40;
  char *local_38;
  
  data = conn->data;
  local_58 = (char *)0x0;
  local_48 = (uchar *)0x0;
  local_40 = 0;
  local_50 = 0;
  *progress = SASL_INPROGRESS;
  sVar2 = sasl->state;
  if (sVar2 == SASL_CANCEL) {
switchD_0012c9ab_caseD_e:
    sasl->authmechs = sasl->authmechs ^ sasl->authused;
    CVar1 = Curl_sasl_start(sasl,conn,sasl->force_ir,progress);
    sVar2 = sasl->state;
    goto LAB_0012cb7f;
  }
  if (sVar2 == SASL_FINAL) {
    CVar1 = CURLE_LOGIN_DENIED;
    if (sasl->params->finalcode == code) {
      CVar1 = CURLE_OK;
    }
    *progress = SASL_DONE;
    sasl->state = SASL_STOP;
    return CVar1;
  }
  if (sasl->params->contcode != code) {
    *progress = SASL_DONE;
    sasl->state = SASL_STOP;
    return CURLE_LOGIN_DENIED;
  }
  switch(sVar2) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return CURLE_OK;
  case SASL_PLAIN:
    CVar1 = sasl_create_plain_message(data,conn->user,conn->passwd,&local_58,&local_50);
    break;
  case SASL_LOGIN:
    CVar1 = sasl_create_login_message(data,conn->user,&local_58,&local_50);
    sVar2 = SASL_LOGIN_PASSWD;
    goto LAB_0012cb7f;
  case SASL_LOGIN_PASSWD:
    valuep = conn->passwd;
    goto LAB_0012cb43;
  case SASL_EXTERNAL:
    valuep = conn->user;
LAB_0012cb43:
    CVar1 = sasl_create_login_message(data,valuep,&local_58,&local_50);
    break;
  case SASL_CRAMMD5:
    (*sasl->params->getmessage)((data->state).buffer,&local_38);
    CVar1 = CURLE_OK;
    local_48 = (uchar *)0x0;
    local_40 = 0;
    if ((*local_38 != '\0') && (*local_38 != '=')) {
      CVar1 = Curl_base64_decode(local_38,&local_48,&local_40);
    }
    if (CVar1 == CURLE_OK) {
      CVar1 = sasl_create_cram_md5_message
                        (data,(char *)local_48,conn->user,conn->passwd,&local_58,&local_50);
    }
    (*Curl_cfree)(local_48);
    break;
  case SASL_DIGESTMD5:
    (*sasl->params->getmessage)((data->state).buffer,&local_38);
    CVar1 = Curl_sasl_create_digest_md5_message
                      (data,local_38,conn->user,conn->passwd,sasl->params->service,&local_58,
                       &local_50);
    sVar2 = SASL_DIGESTMD5_RESP;
    goto LAB_0012cb7f;
  case SASL_DIGESTMD5_RESP:
    local_58 = (*Curl_cstrdup)("");
    CVar1 = CURLE_OUT_OF_MEMORY;
    if (local_58 != (char *)0x0) {
      CVar1 = CURLE_OK;
    }
    break;
  default:
    Curl_failf(data,"Unsupported SASL authentication mechanism");
    sVar2 = SASL_FINAL;
    CVar1 = CURLE_UNSUPPORTED_PROTOCOL;
    goto LAB_0012cb7f;
  case SASL_XOAUTH2:
    CVar1 = sasl_create_xoauth2_message(data,conn->user,conn->xoauth2_bearer,&local_58,&local_50);
    break;
  case SASL_CANCEL:
    goto switchD_0012c9ab_caseD_e;
  }
  sVar2 = SASL_FINAL;
LAB_0012cb7f:
  if (CVar1 == CURLE_OK) {
    if (local_58 == (char *)0x0) {
      CVar1 = CURLE_OK;
    }
    else {
      CVar1 = (*sasl->params->sendcont)(conn,local_58);
    }
  }
  else if (CVar1 == CURLE_BAD_CONTENT_ENCODING) {
    CVar1 = (*sasl->params->sendcont)(conn,"*");
    sVar2 = SASL_CANCEL;
  }
  else {
    *progress = SASL_DONE;
    sVar2 = SASL_STOP;
  }
  (*Curl_cfree)(local_58);
  sasl->state = sVar2;
  return CVar1;
}

Assistant:

CURLcode Curl_sasl_continue(struct SASL *sasl, struct connectdata *conn,
                            int code, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  saslstate newstate = SASL_FINAL;
  char *resp = NULL;
#if !defined(CURL_DISABLE_CRYPTO_AUTH)
  char *serverdata;
  char *chlg = NULL;
  size_t chlglen = 0;
#endif
  size_t len = 0;

  *progress = SASL_INPROGRESS;

  if(sasl->state == SASL_FINAL) {
    if(code != sasl->params->finalcode)
      result = CURLE_LOGIN_DENIED;
    *progress = SASL_DONE;
    state(sasl, conn, SASL_STOP);
    return result;
  }

  if(sasl->state != SASL_CANCEL && code != sasl->params->contcode) {
    *progress = SASL_DONE;
    state(sasl, conn, SASL_STOP);
    return CURLE_LOGIN_DENIED;
  }

  switch(sasl->state) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return result;
  case SASL_PLAIN:
    result = sasl_create_plain_message(data, conn->user, conn->passwd, &resp,
                                       &len);
    break;
  case SASL_LOGIN:
    result = sasl_create_login_message(data, conn->user, &resp, &len);
    newstate = SASL_LOGIN_PASSWD;
    break;
  case SASL_LOGIN_PASSWD:
    result = sasl_create_login_message(data, conn->passwd, &resp, &len);
    break;
  case SASL_EXTERNAL:
    result = sasl_create_external_message(data, conn->user, &resp, &len);
    break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
  case SASL_CRAMMD5:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = sasl_decode_cram_md5_message(serverdata, &chlg, &chlglen);
    if(!result)
      result = sasl_create_cram_md5_message(data, chlg, conn->user,
                                            conn->passwd, &resp, &len);
    free(chlg);
    break;
  case SASL_DIGESTMD5:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_sasl_create_digest_md5_message(data, serverdata,
                                                 conn->user, conn->passwd,
                                                 sasl->params->service,
                                                 &resp, &len);
    newstate = SASL_DIGESTMD5_RESP;
    break;
  case SASL_DIGESTMD5_RESP:
    if(!(resp = strdup("")))
      result = CURLE_OUT_OF_MEMORY;
    break;
#endif

#ifdef USE_NTLM
  case SASL_NTLM:
    /* Create the type-1 message */
    result = Curl_sasl_create_ntlm_type1_message(conn->user, conn->passwd,
                                                 &conn->ntlm, &resp, &len);
    newstate = SASL_NTLM_TYPE2MSG;
    break;
  case SASL_NTLM_TYPE2MSG:
    /* Decode the type-2 message */
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_sasl_decode_ntlm_type2_message(data, serverdata,
                                                 &conn->ntlm);
    if(!result)
      result = Curl_sasl_create_ntlm_type3_message(data, conn->user,
                                                   conn->passwd, &conn->ntlm,
                                                   &resp, &len);
    break;
#endif

#if defined(USE_KERBEROS5)
  case SASL_GSSAPI:
    result = Curl_sasl_create_gssapi_user_message(data, conn->user,
                                                  conn->passwd,
                                                  sasl->params->service,
                                                  sasl->mutual_auth, NULL,
                                                  &conn->krb5,
                                                  &resp, &len);
    newstate = SASL_GSSAPI_TOKEN;
    break;
  case SASL_GSSAPI_TOKEN:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    if(sasl->mutual_auth) {
      /* Decode the user token challenge and create the optional response
         message */
      result = Curl_sasl_create_gssapi_user_message(data, NULL, NULL, NULL,
                                                    sasl->mutual_auth,
                                                    serverdata, &conn->krb5,
                                                    &resp, &len);
      newstate = SASL_GSSAPI_NO_DATA;
    }
    else
      /* Decode the security challenge and create the response message */
      result = Curl_sasl_create_gssapi_security_message(data, serverdata,
                                                        &conn->krb5,
                                                        &resp, &len);
    break;
  case SASL_GSSAPI_NO_DATA:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    /* Decode the security challenge and create the response message */
    result = Curl_sasl_create_gssapi_security_message(data, serverdata,
                                                      &conn->krb5,
                                                      &resp, &len);
    break;
#endif

  case SASL_XOAUTH2:
    /* Create the authorisation message */
    result = sasl_create_xoauth2_message(data, conn->user,
                                         conn->xoauth2_bearer, &resp, &len);
    break;
  case SASL_CANCEL:
    /* Remove the offending mechanism from the supported list */
    sasl->authmechs ^= sasl->authused;

    /* Start an alternative SASL authentication */
    result = Curl_sasl_start(sasl, conn, sasl->force_ir, progress);
    newstate = sasl->state;   /* Use state from Curl_sasl_start() */
    break;
  default:
    failf(data, "Unsupported SASL authentication mechanism");
    result = CURLE_UNSUPPORTED_PROTOCOL;  /* Should not happen */
    break;
  }

  switch(result) {
  case CURLE_BAD_CONTENT_ENCODING:
    /* Cancel dialog */
    result = sasl->params->sendcont(conn, "*");
    newstate = SASL_CANCEL;
    break;
  case CURLE_OK:
    if(resp)
      result = sasl->params->sendcont(conn, resp);
    break;
  default:
    newstate = SASL_STOP;    /* Stop on error */
    *progress = SASL_DONE;
    break;
  }

  free(resp);

  state(sasl, conn, newstate);

  return result;
}